

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

object_ptr __thiscall
mjs::interpreter::impl::create_function
          (impl *this,string *id,shared_ptr<mjs::block_statement> *block,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *param_names,wstring *body_text,scope_ptr *prev_scope)

{
  gc_heap *h;
  element_type *this_00;
  function_object *pfVar1;
  gc_heap_ptr<mjs::gc_string> *body_text_00;
  size_type sVar2;
  statement *s;
  undefined8 extraout_RDX;
  object_ptr oVar3;
  gc_heap_ptr<mjs::interpreter::impl::scope> *in_stack_00000008;
  anon_class_48_3_9fe6017f_for_f local_1c0;
  allocator<wchar_t> local_189;
  wstring_view local_188;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_178;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_158;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_138;
  wstring_view local_118;
  string local_108;
  gc_heap_ptr<mjs::gc_string> local_f8 [2];
  undefined1 local_d8 [8];
  anon_class_144_7_2443f645_for_f func;
  gc_heap_ptr<mjs::function_object> callee;
  wstring *body_text_local;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *param_names_local;
  shared_ptr<mjs::block_statement> *block_local;
  string *id_local;
  impl *this_local;
  
  make_raw_function((mjs *)((long)&func.hv_result.
                                   super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                                   .
                                   super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                                   ._M_head_impl.
                                   super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                   ._M_impl + 0x10),(gc_heap_ptr<mjs::global_object> *)(id + 2));
  local_d8 = (undefined1  [8])id;
  std::shared_ptr<mjs::block_statement>::shared_ptr
            ((shared_ptr<mjs::block_statement> *)&func,
             (shared_ptr<mjs::block_statement> *)param_names);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)&func.block.super___shared_ptr<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount,
           (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)body_text);
  gc_heap_ptr<mjs::interpreter::impl::scope>::gc_heap_ptr
            ((gc_heap_ptr<mjs::interpreter::impl::scope> *)
             &func.param_names.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_00000008);
  gc_heap_ptr<mjs::function_object>::gc_heap_ptr
            ((gc_heap_ptr<mjs::function_object> *)&func.prev_scope.super_gc_heap_ptr_untyped.pos_,
             (gc_heap_ptr<mjs::function_object> *)
             ((long)&func.hv_result.
                     super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl + 0x10));
  string::string((string *)&func.callee.super_gc_heap_ptr_untyped.pos_,(string *)block);
  this_00 = std::__shared_ptr_access<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)param_names);
  hoisting_visitor::scan_abi_cxx11_
            ((scan_result *)
             &func.id.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
             (hoisting_visitor *)this_00,s);
  pfVar1 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)
                      ((long)&func.hv_result.
                              super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                              .
                              super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                              ._M_head_impl.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl + 0x10));
  gc_heap_ptr<mjs::gc_string>::gc_heap_ptr(local_f8,(nullptr_t)0x0);
  h = (id->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_;
  local_188 = string::view((string *)block);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_178,&local_188,&local_189);
  std::operator+(&local_158,L"function ",&local_178);
  std::operator+(&local_138,&local_158,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 prev_scope);
  local_118 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_138);
  string::string(&local_108,h,&local_118);
  body_text_00 = string::unsafe_raw_get(&local_108);
  sVar2 = std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)body_text);
  function_object::
  put_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_1_>
            (pfVar1,(anon_class_144_7_2443f645_for_f *)local_d8,local_f8,body_text_00,(int)sVar2);
  string::~string(&local_108);
  std::__cxx11::wstring::~wstring((wstring *)&local_138);
  std::__cxx11::wstring::~wstring((wstring *)&local_158);
  std::__cxx11::wstring::~wstring((wstring *)&local_178);
  std::allocator<wchar_t>::~allocator(&local_189);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(local_f8);
  pfVar1 = gc_heap_ptr<mjs::function_object>::operator->
                     ((gc_heap_ptr<mjs::function_object> *)
                      ((long)&func.hv_result.
                              super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                              .
                              super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                              ._M_head_impl.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl + 0x10));
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr
            (&local_1c0.global,(gc_heap_ptr<mjs::global_object> *)(id + 2));
  gc_heap_ptr<mjs::function_object>::gc_heap_ptr
            (&local_1c0.callee,
             (gc_heap_ptr<mjs::function_object> *)
             ((long)&func.hv_result.
                     super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl + 0x10));
  string::string(&local_1c0.id,(string *)block);
  function_object::
  construct_function<mjs::interpreter::impl::create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)::_lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)_2_>
            (pfVar1,&local_1c0);
  create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)
  ::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#2}::~value
            ((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___2_
              *)&local_1c0);
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)this,
             (gc_heap_ptr<mjs::function_object> *)
             ((long)&func.hv_result.
                     super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl + 0x10));
  create_function(mjs::string_const&,std::shared_ptr<mjs::block_statement>const&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>const&,std::__cxx11::wstring_const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&)
  ::{lambda(mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)#1}::~value
            ((_lambda_mjs__value_const__std__vector<mjs::value,std::allocator<mjs::value>>const___1_
              *)local_d8);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::function_object> *)
             ((long)&func.hv_result.
                     super__Tuple_impl<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                     .
                     super__Head_base<0UL,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl + 0x10));
  oVar3.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar3.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar3.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr create_function(const string& id, const std::shared_ptr<block_statement>& block, const std::vector<std::wstring>& param_names, const std::wstring& body_text, const scope_ptr& prev_scope) {
        // §15.3.2.1
        auto callee = make_raw_function(global_);
        auto func = [this, block, param_names, prev_scope, callee, id, hv_result = hoisting_visitor::scan(*block)](const value& this_, const std::vector<value>& args) {
            strict_mode_scope sms{*this, block->strict_mode()};
            // Scope
            auto activation = activation_object::make(global_, param_names, args);
            activation->put(global_->common_string("this"), block->strict_mode() ? this_ : get_this_arg(global_, this_), property_attribute::dont_delete | property_attribute::dont_enum | property_attribute::read_only);
            if (!strict_mode_) {
                activation->arguments()->put(global_->common_string("callee"), value{callee}, property_attribute::dont_enum);
            } else {
                global_->define_thrower_accessor(*activation->arguments(), "callee");
                global_->define_thrower_accessor(*activation->arguments(), "caller");
            }
            auto_scope auto_scope_{*this, activation, prev_scope};
            // Variables
            hoist(hv_result);
            if (!id.view().empty()) {
                // Add name of function to activation record even if it's not necessary for function_definition
                // It's needed for function expressions since `a=function x() { x(...); }` is legal, but x isn't added to the containing scope
                // TODO: Should actually be done a separate scope object (See ES3, 13)
                assert(!activation->has_property(id.view())); // TODO: Handle this..
                activation->put(id, value{callee}, property_attribute::dont_delete|property_attribute::read_only);
            }
            return top_level_eval(*block);
        };
        callee->put_function(func, nullptr, string{heap_, L"function " + std::wstring{id.view()} + body_text}.unsafe_raw_get(), static_cast<int>(param_names.size()));

        callee->construct_function([global = global_, callee, id](const value& this_, const std::vector<value>& args) {
            assert(this_.type() == value_type::undefined); (void)this_; // [[maybe_unused]] not working with MSVC here?
            assert(!id.view().empty());
            auto p = callee->get(L"prototype");
            auto o = value{global->heap().make<object>(id, p.type() == value_type::object ? p.object_value() : global->object_prototype())};
            auto r = callee->call(o, args);
            return r.type() == value_type::object ? r : value{o};
        });

        return callee;
    }